

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

void get_inter_predictors_masked_compound
               (MACROBLOCK *x,BLOCK_SIZE bsize,uint8_t **preds0,uint8_t **preds1,int16_t *residual1,
               int16_t *diff10,int *strides)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  MACROBLOCKD *xd_00;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  byte in_SIL;
  long in_RDI;
  int16_t *in_R8;
  int16_t *in_R9;
  buf_2d *src;
  int bh;
  int bw;
  MACROBLOCKD *xd;
  uint8_t **in_stack_00000158;
  int in_stack_00000160;
  int in_stack_00000164;
  int in_stack_00000168;
  BLOCK_SIZE in_stack_0000016f;
  MACROBLOCKD *in_stack_00000170;
  int *in_stack_000001a0;
  undefined7 in_stack_fffffffffffffff0;
  long pred_stride;
  
  xd_00 = (MACROBLOCKD *)(in_RDI + 0x1a0);
  uVar1 = (uint)block_size_wide[in_SIL];
  uVar2 = (uint)block_size_high[in_SIL];
  av1_build_inter_predictors_for_planes_single_buf
            (in_stack_00000170,in_stack_0000016f,in_stack_00000168,in_stack_00000164,
             in_stack_00000160,in_stack_00000158,in_stack_000001a0);
  av1_build_inter_predictors_for_planes_single_buf
            (in_stack_00000170,in_stack_0000016f,in_stack_00000168,in_stack_00000164,
             in_stack_00000160,in_stack_00000158,in_stack_000001a0);
  pred_stride = in_RDI;
  iVar3 = is_cur_buf_hbd(xd_00);
  if (iVar3 == 0) {
    (*aom_subtract_block)
              (uVar2,uVar1,in_R8,(long)(int)uVar1,*(uint8_t **)(in_RDI + 0x30),
               (long)*(int *)(in_RDI + 0x48),(uint8_t *)*in_RCX,(long)(int)uVar1);
    (*aom_subtract_block)
              (uVar2,uVar1,in_R9,(long)(int)uVar1,(uint8_t *)*in_RCX,(long)(int)uVar1,
               (uint8_t *)*in_RDX,(long)(int)uVar1);
  }
  else {
    aom_highbd_subtract_block_sse2
              ((int)((ulong)in_RCX >> 0x20),(int)in_RCX,in_R8,(ptrdiff_t)in_R9,(uint8_t *)xd_00,
               CONCAT44(uVar1,uVar2),(uint8_t *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               pred_stride);
    aom_highbd_subtract_block_sse2
              ((int)((ulong)in_RCX >> 0x20),(int)in_RCX,in_R8,(ptrdiff_t)in_R9,(uint8_t *)xd_00,
               CONCAT44(uVar1,uVar2),(uint8_t *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               pred_stride);
  }
  return;
}

Assistant:

static inline void get_inter_predictors_masked_compound(
    MACROBLOCK *x, const BLOCK_SIZE bsize, uint8_t **preds0, uint8_t **preds1,
    int16_t *residual1, int16_t *diff10, int *strides) {
  MACROBLOCKD *xd = &x->e_mbd;
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  // get inter predictors to use for masked compound modes
  av1_build_inter_predictors_for_planes_single_buf(xd, bsize, 0, 0, 0, preds0,
                                                   strides);
  av1_build_inter_predictors_for_planes_single_buf(xd, bsize, 0, 0, 1, preds1,
                                                   strides);
  const struct buf_2d *const src = &x->plane[0].src;
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    aom_highbd_subtract_block(bh, bw, residual1, bw, src->buf, src->stride,
                              CONVERT_TO_BYTEPTR(*preds1), bw);
    aom_highbd_subtract_block(bh, bw, diff10, bw, CONVERT_TO_BYTEPTR(*preds1),
                              bw, CONVERT_TO_BYTEPTR(*preds0), bw);
  } else {
    aom_subtract_block(bh, bw, residual1, bw, src->buf, src->stride, *preds1,
                       bw);
    aom_subtract_block(bh, bw, diff10, bw, *preds1, bw, *preds0, bw);
  }
#else
  aom_subtract_block(bh, bw, residual1, bw, src->buf, src->stride, *preds1, bw);
  aom_subtract_block(bh, bw, diff10, bw, *preds1, bw, *preds0, bw);
#endif
}